

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.h
# Opt level: O0

void __thiscall
fast_float::stackvec<(unsigned_short)62>::resize_unchecked
          (stackvec<(unsigned_short)62> *this,size_t new_len,limb value)

{
  unsigned_long *puVar1;
  unsigned_long *in_RSI;
  stackvec<(unsigned_short)62> *in_RDI;
  limb *last;
  limb *first;
  size_t count;
  
  puVar1 = (unsigned_long *)len(in_RDI);
  if (puVar1 < in_RSI) {
    puVar1 = in_RSI;
    len(in_RDI);
    len(in_RDI);
    std::fill<unsigned_long*,unsigned_long>(in_RDI->data,puVar1,(unsigned_long *)0x16cead);
    set_len(in_RDI,(size_t)in_RSI);
  }
  else {
    set_len(in_RDI,(size_t)in_RSI);
  }
  return;
}

Assistant:

void resize_unchecked(size_t new_len, limb value) noexcept {
    if (new_len > len()) {
      size_t count = new_len - len();
      limb* first = data + len();
      limb* last = first + count;
      ::std::fill(first, last, value);
      set_len(new_len);
    } else {
      set_len(new_len);
    }
  }